

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::HandleDiagGetAnswer(CommissionerImpl *this,Request *aRequest)

{
  bool bVar1;
  Endpoint *pEVar2;
  ByteArray *aPayload;
  Error *aError;
  utils *this_00;
  ByteArray *aBytes;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  anon_class_1_0_00000001 local_40a;
  v10 local_409;
  v10 *local_408;
  char *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator local_3d1;
  string local_3d0;
  ErrorCode local_3ac;
  string local_3a8;
  anon_class_1_0_00000001 local_382;
  v10 local_381;
  v10 *local_380;
  char *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator local_349;
  string local_348;
  ErrorCode local_324;
  Error local_320;
  anon_class_1_0_00000001 local_2f2;
  v10 local_2f1;
  v10 *local_2f0;
  char *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator local_2b9;
  string local_2b8;
  Address local_288;
  undefined1 local_270 [8];
  string peerAddr;
  Error error;
  Request *aRequest_local;
  CommissionerImpl *this_local;
  undefined1 local_208 [16];
  v10 *local_1f8;
  char *local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  v10 *local_1e0;
  char *pcStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  char *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_198;
  v10 *local_190;
  char *pcStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  v10 *local_178;
  v10 **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168 [3];
  undefined1 local_150 [16];
  v10 *local_140;
  char *local_138;
  string *local_130;
  v10 *local_128;
  char *pcStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f0;
  undefined1 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  CommissionerImpl **local_a0;
  undefined1 *local_98;
  CommissionerImpl **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  CommissionerImpl **local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  v10 **local_60;
  v10 *local_58;
  char *pcStack_50;
  v10 **local_40;
  v10 *local_38;
  char *pcStack_30;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  Error::Error((Error *)((long)&peerAddr.field_2 + 8));
  pEVar2 = coap::Message::GetEndpoint(aRequest);
  (*pEVar2->_vptr_Endpoint[3])(&local_288);
  Address::ToString_abi_cxx11_((string *)local_270,&local_288);
  Address::~Address(&local_288);
  std::allocator<char>::allocator();
  pcVar3 = "meshdiag";
  std::__cxx11::string::string((string *)&local_2b8,"meshdiag",&local_2b9);
  HandleDiagGetAnswer::anon_class_1_0_00000001::operator()(&local_2f2);
  local_170 = &local_2f0;
  local_178 = &local_2f1;
  bVar4 = ::fmt::v10::operator()(local_178);
  local_2e8 = (char *)bVar4.size_;
  local_2f0 = (v10 *)bVar4.data_;
  ::fmt::v10::detail::
  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_180 = &local_2e0;
  local_190 = local_2f0;
  pcStack_188 = local_2e8;
  local_198 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_270;
  local_60 = &local_190;
  local_1a8 = local_2f0;
  local_1a0 = local_2e8;
  local_58 = local_1a8;
  pcStack_50 = local_1a0;
  local_1c8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                           (local_198,(v10 *)pcVar3,local_180);
  local_c0 = local_1b8;
  local_c8 = local_1c8;
  local_b0 = 0xd;
  fmt.size_ = 0xd;
  fmt.data_ = local_1a0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_c8;
  local_b8 = local_c8;
  local_a8 = local_c0;
  local_70 = local_c8;
  ::fmt::v10::vformat_abi_cxx11_(&local_2e0,local_1a8,fmt,args);
  Log(kInfo,&local_2b8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  aPayload = coap::Message::GetPayload(aRequest);
  internal::DecodeNetDiagData(&local_320,&this->mDiagAnsTlvs,aPayload);
  aError = Error::operator=((Error *)((long)&peerAddr.field_2 + 8),&local_320);
  local_324 = kNone;
  bVar1 = commissioner::operator!=(aError,&local_324);
  Error::~Error(&local_320);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_348,"meshdiag",&local_349);
    HandleDiagGetAnswer::anon_class_1_0_00000001::operator()(&local_382);
    local_108 = &local_380;
    local_110 = &local_381;
    bVar4 = ::fmt::v10::operator()(local_110);
    local_378 = (char *)bVar4.size_;
    local_380 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    this_00 = (utils *)coap::Message::GetPayload(aRequest);
    utils::Hex_abi_cxx11_(&local_3a8,this_00,aBytes);
    local_118 = &local_370;
    local_128 = local_380;
    pcStack_120 = local_378;
    local_130 = &local_3a8;
    local_20 = &local_128;
    local_140 = local_380;
    local_138 = local_378;
    local_18 = local_140;
    pcStack_10 = local_138;
    local_168[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_130,(v10 *)this_00,local_118);
    local_e8 = local_150;
    local_f0 = local_168;
    local_d8 = 0xd;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = local_138;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_f0;
    local_e0 = local_f0;
    local_d0 = local_e8;
    local_68 = local_f0;
    ::fmt::v10::vformat_abi_cxx11_(&local_370,local_140,fmt_00,args_00);
    Log(kInfo,&local_348,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[6])
              (this->mCommissionerHandler,local_270,&this->mDiagAnsTlvs);
  }
  local_3ac = kNone;
  bVar1 = commissioner::operator!=((Error *)((long)&peerAddr.field_2 + 8),&local_3ac);
  if (bVar1) {
    std::allocator<char>::allocator();
    pcVar3 = "meshdiag";
    std::__cxx11::string::string((string *)&local_3d0,"meshdiag",&local_3d1);
    HandleDiagGetAnswer::anon_class_1_0_00000001::operator()(&local_40a);
    local_f8 = &local_408;
    local_100 = &local_409;
    bVar4 = ::fmt::v10::operator()(local_100);
    local_400 = (char *)bVar4.size_;
    local_408 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_1d0 = &local_3f8;
    local_1e0 = local_408;
    pcStack_1d8 = local_400;
    local_1e8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_270;
    local_40 = &local_1e0;
    local_1f8 = local_408;
    local_1f0 = local_400;
    local_38 = local_1f8;
    pcStack_30 = local_1f0;
    this_local = (CommissionerImpl *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                           (local_1e8,(v10 *)pcVar3,local_1d0);
    local_98 = local_208;
    local_a0 = &this_local;
    local_88 = 0xd;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = local_1f0;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_a0;
    local_90 = local_a0;
    local_80 = local_98;
    local_78 = local_a0;
    ::fmt::v10::vformat_abi_cxx11_(&local_3f8,local_1f8,fmt_01,args_01);
    Log(kError,&local_3d0,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  }
  std::__cxx11::string::~string((string *)local_270);
  Error::~Error((Error *)((long)&peerAddr.field_2 + 8));
  return;
}

Assistant:

void CommissionerImpl::HandleDiagGetAnswer(const coap::Request &aRequest)
{
    Error       error;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MESHDIAG, "received DIAG_GET.ans from {}", peerAddr);
    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = internal::DecodeNetDiagData(mDiagAnsTlvs, aRequest.GetPayload()));
    LOG_INFO(LOG_REGION_MESHDIAG, "accepted DIAG_GET.ans data {}", utils::Hex(aRequest.GetPayload()));

    mCommissionerHandler.OnDiagGetAnswerMessage(peerAddr, mDiagAnsTlvs);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_MESHDIAG, "failed to handle DIAG_GET.ans from {}", peerAddr);
    }
}